

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.h
# Opt level: O3

ostream * operator<<(ostream *o,Bounds *bounds)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"(",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)o,bounds->lower);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,bounds->upper);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return o;
}

Assistant:

std::ostream& operator << (std::ostream &o, const Bounds &bounds)
{
	o << "(" << bounds.lower << ", " << bounds.upper << ")";
	return o;
}